

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,ShapeSampleContext *ctx,
          Point2f u)

{
  Float FVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Transform *pTVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  anon_struct_8_0_00000001_for___align aVar17;
  undefined1 auVar18 [16];
  uint uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  Point3f PVar71;
  float local_f0;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_98;
  bool local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar42 [56];
  
  pTVar7 = this->renderFromObject;
  auVar51 = ZEXT816(0) << 0x40;
  uStack_e0 = (undefined4)in_XMM0_Qb;
  uStack_dc = (undefined4)((ulong)in_XMM0_Qb >> 0x20);
  auVar25 = vinsertps_avx(ZEXT416((uint)(pTVar7->m).m[0][1]),ZEXT416((uint)(pTVar7->m).m[1][1]),0x10
                         );
  auVar26 = vinsertps_avx(ZEXT416((uint)(pTVar7->m).m[0][2]),ZEXT416((uint)(pTVar7->m).m[1][2]),0x10
                         );
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[2][1] * 0.0)),auVar51,
                            ZEXT416((uint)(pTVar7->m).m[2][0]));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[3][1] * 0.0)),auVar51,
                            ZEXT416((uint)(pTVar7->m).m[3][0]));
  auVar33 = vfmadd231ss_fma(auVar27,auVar51,ZEXT416((uint)(pTVar7->m).m[2][2]));
  auVar28 = vfmadd231ss_fma(auVar28,auVar51,ZEXT416((uint)(pTVar7->m).m[3][2]));
  auVar27 = vinsertps_avx(ZEXT416((uint)(pTVar7->m).m[0][0]),ZEXT416((uint)(pTVar7->m).m[1][0]),0x10
                         );
  auVar51._0_4_ = auVar25._0_4_ * 0.0;
  auVar51._4_4_ = auVar25._4_4_ * 0.0;
  auVar51._8_4_ = auVar25._8_4_ * 0.0;
  auVar51._12_4_ = auVar25._12_4_ * 0.0;
  fVar56 = auVar28._0_4_ + (pTVar7->m).m[3][3];
  fVar49 = auVar33._0_4_ + (pTVar7->m).m[2][3];
  bVar9 = fVar56 == 1.0;
  auVar25 = vfmadd213ps_fma(auVar27,ZEXT816(0) << 0x40,auVar51);
  auVar26 = vfmadd213ps_fma(auVar26,ZEXT816(0) << 0x40,auVar25);
  auVar25 = vinsertps_avx(ZEXT416((uint)(pTVar7->m).m[0][3]),ZEXT416((uint)(pTVar7->m).m[1][3]),0x10
                         );
  auVar27._4_4_ = fVar56;
  auVar27._0_4_ = fVar56;
  auVar27._8_4_ = fVar56;
  auVar27._12_4_ = fVar56;
  uVar19 = 0xff;
  if (!bVar9) {
    uVar19 = 0;
  }
  uVar20 = (ulong)uVar19;
  if (NAN(fVar56)) {
    uVar20 = 0;
  }
  auVar52._0_4_ = auVar26._0_4_ + auVar25._0_4_;
  auVar52._4_4_ = auVar26._4_4_ + auVar25._4_4_;
  auVar52._8_4_ = auVar26._8_4_ + auVar25._8_4_;
  auVar52._12_4_ = auVar26._12_4_ + auVar25._12_4_;
  auVar25 = vdivps_avx(auVar52,auVar27);
  bVar8 = (bool)((byte)uVar20 & 1);
  fVar21 = (float)((uint)bVar8 * (int)auVar52._0_4_ | (uint)!bVar8 * auVar25._0_4_);
  bVar8 = (bool)((byte)(uVar20 >> 1) & 1);
  fVar29 = (float)((uint)bVar8 * (int)auVar52._4_4_ | (uint)!bVar8 * auVar25._4_4_);
  bVar8 = (bool)((byte)(uVar20 >> 2) & 1);
  fVar30 = (float)((uint)bVar8 * (int)auVar52._8_4_ | (uint)!bVar8 * auVar25._8_4_);
  bVar8 = (bool)((byte)(uVar20 >> 3) & 1);
  fVar31 = (float)((uint)bVar8 * (int)auVar52._12_4_ | (uint)!bVar8 * auVar25._12_4_);
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  fVar22 = (float)((uint)bVar9 * (int)fVar49 + (uint)!bVar9 * (int)(fVar49 / fVar56));
  auVar25._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar25._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar25._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar25._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  local_98._8_4_ =
       fVar22 + ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  auVar33._0_4_ = (float)uVar2 + auVar25._0_4_;
  auVar33._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar25._4_4_;
  auVar33._8_4_ = auVar25._8_4_ + 0.0;
  auVar33._12_4_ = auVar25._12_4_ + 0.0;
  auVar26._8_4_ = 0xbf000000;
  auVar26._0_8_ = 0xbf000000bf000000;
  auVar26._12_4_ = 0xbf000000;
  auVar25 = vmulps_avx512vl(auVar33,auVar26);
  auVar34._0_4_ = fVar21 + auVar25._0_4_;
  auVar34._4_4_ = fVar29 + auVar25._4_4_;
  auVar34._8_4_ = fVar30 + auVar25._8_4_;
  auVar34._12_4_ = fVar31 + auVar25._12_4_;
  auVar42 = ZEXT856(auVar34._8_8_);
  uVar2 = vmovlps_avx(auVar34);
  local_98._0_4_ = (undefined4)uVar2;
  local_98._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  PVar71 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_98.__align);
  auVar39._0_8_ = PVar71.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar39._8_56_ = auVar42;
  auVar28._4_4_ = fVar29;
  auVar28._0_4_ = fVar21;
  auVar28._8_4_ = fVar30;
  auVar28._12_4_ = fVar31;
  auVar25 = vsubps_avx(auVar39._0_16_,auVar28);
  fVar49 = PVar71.super_Tuple3<pbrt::Point3,_float>.z - fVar22;
  auVar35._0_4_ = auVar25._0_4_ * auVar25._0_4_;
  auVar35._4_4_ = auVar25._4_4_ * auVar25._4_4_;
  auVar35._8_4_ = auVar25._8_4_ * auVar25._8_4_;
  auVar35._12_4_ = auVar25._12_4_ * auVar25._12_4_;
  auVar25 = vhaddps_avx(auVar35,auVar35);
  fVar56 = this->radius;
  if (fVar49 * fVar49 + auVar25._0_4_ <= fVar56 * fVar56) {
    Sample((optional<pbrt::ShapeSample> *)&local_98.__align,this,u);
    if (local_40 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
    }
    FVar1 = ctx->time;
    auVar18._4_4_ = local_98._4_4_;
    auVar18._0_4_ = local_98._0_4_;
    auVar18._8_4_ = local_98._8_4_;
    auVar18._12_4_ = local_98._12_4_;
    auVar4._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar4._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar4._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar4._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar25 = vinsertps_avx(auVar18,ZEXT416((uint)local_98._12_4_),0x10);
    auVar26 = vinsertps_avx(auVar4,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    fVar21 = ((float)local_98._16_4_ + (float)local_98._20_4_) * 0.5;
    auVar45._0_4_ = ((float)local_98._4_4_ + auVar25._0_4_) * 0.5;
    auVar45._4_4_ = ((float)local_98._8_4_ + auVar25._4_4_) * 0.5;
    auVar45._8_4_ = (auVar25._8_4_ + 0.0) * 0.5;
    auVar45._12_4_ = (auVar25._12_4_ + 0.0) * 0.5;
    auVar53._0_4_ = ((float)uVar2 + auVar26._0_4_) * 0.5;
    auVar53._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar26._4_4_) * 0.5;
    auVar53._8_4_ = (auVar26._8_4_ + 0.0) * 0.5;
    auVar53._12_4_ = (auVar26._12_4_ + 0.0) * 0.5;
    fVar22 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar26 = vsubps_avx(auVar45,auVar53);
    fVar49 = auVar26._0_4_;
    auVar62._0_4_ = fVar49 * fVar49;
    auVar62._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar62._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar62._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar25 = vhaddps_avx(auVar62,auVar62);
    fVar29 = fVar21 - fVar22;
    fVar56 = auVar25._0_4_ + fVar29 * fVar29;
    if ((fVar56 != 0.0) || (NAN(fVar56))) {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar28 = vxorps_avx512vl(ZEXT416((uint)fVar29),auVar13);
      auVar25 = vsubps_avx(auVar53,auVar45);
      fVar22 = fVar22 - fVar21;
      auVar46._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar46._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar46._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar46._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar25 = vhaddps_avx(auVar46,auVar46);
      fVar56 = auVar27._0_4_;
      auVar63._0_4_ = auVar28._0_4_ / fVar56;
      auVar63._4_12_ = auVar28._4_12_;
      auVar65._0_4_ = fVar49 / fVar56;
      auVar65._4_12_ = auVar26._4_12_;
      auVar26 = vmovshdup_avx(auVar26);
      auVar60._0_4_ = auVar26._0_4_ / fVar56;
      auVar60._4_12_ = auVar26._4_12_;
      auVar27 = vfnmadd132ss_fma(auVar60,ZEXT416((uint)(auVar63._0_4_ * (float)local_98._48_4_)),
                                 ZEXT416((uint)local_98._44_4_));
      auVar26 = vfmsub213ss_fma(auVar63,ZEXT416((uint)local_98._48_4_),
                                ZEXT416((uint)(auVar63._0_4_ * (float)local_98._48_4_)));
      auVar26 = vfnmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ + auVar26._0_4_)),auVar65,
                                 ZEXT416((uint)local_98._40_4_));
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx512vl(auVar26,auVar14);
      fVar56 = (float)local_98._80_4_ / (auVar26._0_4_ / (auVar25._0_4_ + fVar22 * fVar22));
      if (ABS(fVar56) != INFINITY) {
        aVar17._4_4_ = local_98._4_4_;
        aVar17._0_4_ = local_98._0_4_;
        __return_storage_ptr__->set = local_40;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_98._64_8_;
        (__return_storage_ptr__->optionalValue).__align = aVar17;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_98._12_4_,local_98._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_98._20_4_,local_98._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_98._28_4_,FVar1);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_98._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_98._44_4_,local_98._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_98._52_4_,local_98._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_98._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_98._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar56;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    auVar3._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar3._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar3._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar3._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar25 = vinsertps_avx(auVar3,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    fVar49 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar22;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar43._0_4_ = (float)uVar2 + auVar25._0_4_;
    auVar43._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar25._4_4_;
    auVar43._8_4_ = auVar25._8_4_ + 0.0;
    auVar43._12_4_ = auVar25._12_4_ + 0.0;
    auVar10._8_4_ = 0x3f000000;
    auVar10._0_8_ = 0x3f0000003f000000;
    auVar10._12_4_ = 0x3f000000;
    auVar25 = vmulps_avx512vl(auVar43,auVar10);
    auVar25 = vsubps_avx(auVar25,auVar28);
    auVar44._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar44._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar44._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar44._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar25 = vhaddps_avx(auVar44,auVar44);
    auVar25 = ZEXT416((uint)(auVar25._0_4_ + fVar49 * fVar49));
    auVar25 = vsqrtss_avx(auVar25,auVar25);
    fVar56 = fVar56 / auVar25._0_4_;
    fVar49 = fVar56 * fVar56;
    if (0.00068523 <= fVar49) {
      auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar49)),ZEXT416(0));
      auVar5._8_4_ = uStack_e0;
      auVar5._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
      auVar5._12_4_ = uStack_dc;
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      local_f0 = 1.0 - auVar25._0_4_;
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ + -1.0)),auVar5,
                                SUB6416(ZEXT464(0x3f800000),0));
      fVar61 = 1.0 - auVar25._0_4_ * auVar25._0_4_;
    }
    else {
      fVar61 = u.super_Tuple2<pbrt::Point2,_float>.x * fVar49;
      fVar59 = 1.0 - fVar61;
      if (fVar59 < 0.0) {
        auVar40._0_4_ = sqrtf(fVar59);
        auVar40._4_60_ = extraout_var;
        auVar25 = auVar40._0_16_;
      }
      else {
        auVar25 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
      }
      auVar5._8_4_ = uStack_e0;
      auVar5._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
      auVar5._12_4_ = uStack_dc;
      local_f0 = fVar49 * 0.5;
    }
    auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar61 / fVar49)),ZEXT816(0) << 0x40);
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    auVar27 = vfmadd213ss_fma(auVar26,auVar25,ZEXT416((uint)(fVar61 / fVar56)));
    fVar49 = auVar27._0_4_;
    auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar49 * fVar49)),ZEXT816(0) << 0x40);
    auVar26 = vsqrtss_avx(auVar25,auVar25);
    auVar25 = vmovshdup_avx(auVar5);
    fVar56 = (auVar25._0_4_ + auVar25._0_4_) * 3.1415927;
    fVar32 = cosf(fVar56);
    auVar41._0_4_ = sinf(fVar56);
    auVar41._4_60_ = extraout_var_00;
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar6._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = 0x3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    auVar25 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    uVar2 = vcmpss_avx512f(auVar68,auVar26,1);
    bVar9 = (bool)((byte)uVar2 & 1);
    fVar56 = fVar22 + ((ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    fVar23 = (float)((uint)bVar9 * -0x40800000 + (uint)!bVar9 * (auVar26._0_4_ ^ 0x80000000));
    uVar2 = vcmpss_avx512f(auVar68,auVar27,1);
    bVar9 = (bool)((byte)uVar2 & 1);
    uVar2 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar8 = (bool)((byte)uVar2 & 1);
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    fVar24 = (float)((uint)bVar8 * 0x3f800000 +
                    (uint)!bVar8 * ((uint)bVar9 * -0x40800000 + (uint)!bVar9 * (int)-fVar49));
    auVar54._0_4_ = (float)uVar2 + auVar25._0_4_;
    auVar54._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar25._4_4_;
    auVar54._8_4_ = auVar25._8_4_ + 0.0;
    auVar54._12_4_ = auVar25._12_4_ + 0.0;
    auVar11._8_4_ = 0xbf000000;
    auVar11._0_8_ = 0xbf000000bf000000;
    auVar11._12_4_ = 0xbf000000;
    auVar25 = vmulps_avx512vl(auVar54,auVar11);
    auVar55._0_4_ = fVar21 + auVar25._0_4_;
    auVar55._4_4_ = fVar29 + auVar25._4_4_;
    auVar55._8_4_ = fVar30 + auVar25._8_4_;
    auVar55._12_4_ = fVar31 + auVar25._12_4_;
    auVar66._0_4_ = auVar55._0_4_ * auVar55._0_4_;
    auVar66._4_4_ = auVar55._4_4_ * auVar55._4_4_;
    auVar66._8_4_ = auVar55._8_4_ * auVar55._8_4_;
    auVar66._12_4_ = auVar55._12_4_ * auVar55._12_4_;
    auVar25 = vhaddps_avx(auVar66,auVar66);
    auVar25 = ZEXT416((uint)(auVar25._0_4_ + fVar56 * fVar56));
    auVar25 = vsqrtss_avx(auVar25,auVar25);
    fVar49 = auVar25._0_4_;
    auVar57._0_4_ = fVar56 / fVar49;
    auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar67._4_4_ = fVar49;
    auVar67._0_4_ = fVar49;
    auVar67._8_4_ = fVar49;
    auVar67._12_4_ = fVar49;
    auVar25 = vdivps_avx(auVar55,auVar67);
    auVar27 = vpternlogd_avx512vl(auVar68,auVar57,auVar47,0xf8);
    fVar58 = auVar27._0_4_;
    fVar50 = auVar25._0_4_;
    auVar64._0_4_ = -1.0 / (auVar57._0_4_ + fVar58);
    auVar26 = vmovshdup_avx(auVar25);
    auVar69._0_4_ = fVar50 * fVar58 * fVar50;
    fVar56 = auVar25._4_4_;
    auVar69._4_4_ = fVar56 * 0.0;
    fVar49 = auVar25._8_4_;
    auVar69._8_4_ = fVar49 * 0.0;
    fVar61 = auVar25._12_4_;
    auVar69._12_4_ = fVar61 * 0.0;
    fVar59 = auVar26._0_4_ * fVar50 * auVar64._0_4_;
    auVar64._4_4_ = auVar64._0_4_;
    auVar64._8_4_ = auVar64._0_4_;
    auVar64._12_4_ = auVar64._0_4_;
    auVar25 = vunpcklps_avx(auVar70,auVar27);
    auVar27 = vfmadd231ps_fma(auVar25,auVar69,auVar64);
    auVar15._4_4_ = extraout_XMM0_Db;
    auVar15._0_4_ = fVar32;
    auVar15._8_4_ = extraout_XMM0_Dc;
    auVar15._12_4_ = extraout_XMM0_Dd;
    auVar25 = vinsertps_avx(auVar15,auVar41._0_16_,0x10);
    auVar36._0_4_ = auVar25._0_4_ * fVar23;
    auVar36._4_4_ = auVar25._4_4_ * fVar23;
    auVar36._8_4_ = auVar25._8_4_ * fVar23;
    auVar36._12_4_ = auVar25._12_4_ * fVar23;
    auVar28 = vpermi2ps_avx512vl(_DAT_02805e30,ZEXT416((uint)(fVar59 * fVar58)),
                                 ZEXT416((uint)fVar59));
    auVar26 = vshufps_avx(auVar36,auVar36,0xe1);
    auVar37._0_4_ = auVar36._0_4_ * fVar50;
    auVar37._4_4_ = auVar36._4_4_ * fVar56;
    auVar37._8_4_ = auVar36._8_4_ * fVar49;
    auVar37._12_4_ = auVar36._12_4_ * fVar61;
    auVar25 = vmovshdup_avx(auVar37);
    fVar59 = fVar24 * fVar50 + auVar36._0_4_ * auVar27._0_4_ + auVar26._0_4_ * auVar28._0_4_;
    fVar23 = fVar24 * fVar56 + auVar36._4_4_ * auVar27._4_4_ + auVar26._4_4_ * auVar28._4_4_;
    fVar32 = fVar24 * fVar49 + auVar36._8_4_ * auVar27._8_4_ + auVar26._8_4_ * auVar28._8_4_;
    fVar61 = fVar24 * fVar61 + auVar36._12_4_ * auVar27._12_4_ + auVar26._12_4_ * auVar28._12_4_;
    fVar49 = fVar24 * auVar57._0_4_ + (-fVar58 * fVar50 * auVar36._0_4_ - auVar25._0_4_);
    fVar56 = this->radius;
    auVar38._0_4_ = fVar21 + fVar56 * fVar59;
    auVar38._4_4_ = fVar29 + fVar56 * fVar23;
    auVar38._8_4_ = fVar30 + fVar56 * fVar32;
    auVar38._12_4_ = fVar31 + fVar56 * fVar61;
    local_98._8_4_ = fVar22 + fVar56 * fVar49;
    uVar2 = vmovlps_avx(auVar38);
    local_98._0_4_ = (undefined4)uVar2;
    local_98._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    bVar9 = this->reverseOrientation;
    if (bVar9 != false) {
      fVar59 = -fVar59;
      fVar23 = -fVar23;
      fVar32 = -fVar32;
      fVar61 = -fVar61;
    }
    auVar48._8_4_ = 0x7fffffff;
    auVar48._0_8_ = 0x7fffffff7fffffff;
    auVar48._12_4_ = 0x7fffffff;
    auVar25 = vandps_avx(auVar38,auVar48);
    auVar26 = vandps_avx(ZEXT416((uint)local_98._8_4_),auVar48);
    auVar12._8_4_ = 0x34a00003;
    auVar12._0_8_ = 0x34a0000334a00003;
    auVar12._12_4_ = 0x34a00003;
    auVar25 = vmulps_avx512vl(auVar25,auVar12);
    local_30.z = auVar26._0_4_ * 2.980233e-07;
    local_30._0_8_ = vmovlps_avx(auVar25);
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&local_98.__align,
                       (Vector3f *)&local_30);
    FVar1 = ctx->time;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar1;
    auVar16._4_4_ = fVar23;
    auVar16._0_4_ = fVar59;
    auVar16._8_4_ = fVar32;
    auVar16._12_4_ = fVar61;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    uVar2 = vmovlps_avx(auVar16);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar2;
    *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         (uint)(bVar9 & 1) * (int)-fVar49 + (uint)!(bool)(bVar9 & 1) * (int)fVar49;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = ZEXT816(0) << 0x20
    ;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / (local_f0 * 6.2831855);
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Sample uniformly on sphere if $\pt{}$ is inside it
        Point3f pCenter = (*renderFromObject)(Point3f(0, 0, 0));
        Point3f pOrigin = ctx.OffsetRayOrigin(pCenter);
        if (DistanceSquared(pOrigin, pCenter) <= Sqr(radius)) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample sphere uniformly inside subtended cone
        // Compute quantities related the $\theta_\roman{max}$ for cone
        Float sinThetaMax = radius / Distance(ctx.p(), pCenter);
        Float sin2ThetaMax = Sqr(sinThetaMax);
        Float cosThetaMax = SafeSqrt(1 - sin2ThetaMax);
        Float oneMinusCosThetaMax = 1 - cosThetaMax;

        // Compute $\theta$ and $\phi$ values for sample in cone
        Float cosTheta = (cosThetaMax - 1) * u[0] + 1;
        Float sin2Theta = 1 - Sqr(cosTheta);
        if (sin2ThetaMax < 0.00068523f /* sin^2(1.5 deg) */) {
            // Compute cone sample via Taylor series expansion for small angles
            sin2Theta = sin2ThetaMax * u[0];
            cosTheta = std::sqrt(1 - sin2Theta);
            oneMinusCosThetaMax = sin2ThetaMax / 2;
        }

        // Compute angle $\alpha$ from center of sphere to sampled point on surface
        Float cosAlpha = sin2Theta / sinThetaMax +
                         cosTheta * SafeSqrt(1 - sin2Theta / Sqr(sinThetaMax));
        Float sinAlpha = SafeSqrt(1 - Sqr(cosAlpha));

        // Compute surface normal and sampled point on sphere
        Float phi = u[1] * 2 * Pi;
        Vector3f w = SphericalDirection(sinAlpha, cosAlpha, phi);
        Frame samplingFrame = Frame::FromZ(Normalize(pCenter - ctx.p()));
        Normal3f n(samplingFrame.FromLocal(-w));
        Point3f p = pCenter + radius * Point3f(n.x, n.y, n.z);
        if (reverseOrientation)
            n *= -1;

        // Return _ShapeSample_ for sampled point on sphere
        // Compute _pError_ for sampled point on sphere
        Vector3f pError = gamma(5) * Abs((Vector3f)p);

        DCHECK_NE(oneMinusCosThetaMax, 0);  // very small far away sphere
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time),
                           1 / (2 * Pi * oneMinusCosThetaMax)};
    }